

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_nodes.cpp
# Opt level: O1

MultiFileOptions *
duckdb::MultiFileOptions::Deserialize
          (MultiFileOptions *__return_storage_ptr__,Deserializer *deserializer)

{
  undefined1 uVar1;
  uint uVar2;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  int iVar3;
  
  __return_storage_ptr__->filename = false;
  __return_storage_ptr__->hive_partitioning = false;
  __return_storage_ptr__->auto_detect_hive_partitioning = true;
  __return_storage_ptr__->union_by_name = false;
  __return_storage_ptr__->hive_types_autocast = true;
  __return_storage_ptr__->mapping = BY_NAME;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_buckets =
       &(__return_storage_ptr__->hive_types_schema)._M_h._M_single_bucket;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_element_count = 0;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->hive_types_schema)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (__return_storage_ptr__->filename_column)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->filename_column).field_2;
  (__return_storage_ptr__->filename_column).field_2._M_allocated_capacity = 0x656d616e656c6966;
  (__return_storage_ptr__->filename_column)._M_string_length = 8;
  (__return_storage_ptr__->filename_column).field_2._M_local_buf[8] = '\0';
  (__return_storage_ptr__->custom_options)._M_h._M_buckets =
       &(__return_storage_ptr__->custom_options)._M_h._M_single_bucket;
  (__return_storage_ptr__->custom_options)._M_h._M_bucket_count = 1;
  (__return_storage_ptr__->custom_options)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (__return_storage_ptr__->custom_options)._M_h._M_element_count = 0;
  (__return_storage_ptr__->custom_options)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (__return_storage_ptr__->custom_options)._M_h._M_rehash_policy._M_next_resize = 0;
  (__return_storage_ptr__->custom_options)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,100,"filename");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->filename = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x65,"hive_partitioning");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->hive_partitioning = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x66,"auto_detect_hive_partitioning");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->auto_detect_hive_partitioning = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x67,"union_by_name");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->union_by_name = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x68,"hive_types_autocast");
  if ((char)uVar2 == '\0') {
    uVar1 = false;
  }
  else {
    iVar3 = (*deserializer->_vptr_Deserializer[0xc])(deserializer);
    uVar1 = (undefined1)iVar3;
  }
  __return_storage_ptr__->hive_types_autocast = (bool)uVar1;
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  Deserializer::
  ReadPropertyWithDefault<std::unordered_map<std::__cxx11::string,duckdb::LogicalType,duckdb::CaseInsensitiveStringHashFunction,duckdb::CaseInsensitiveStringEquality,std::allocator<std::pair<std::__cxx11::string_const,duckdb::LogicalType>>>>
            (deserializer,0x69,"hive_types_schema",&__return_storage_ptr__->hive_types_schema);
  local_70[0] = local_60;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"filename","");
  uVar2 = (*deserializer->_vptr_Deserializer[4])(deserializer,0x6a,"filename_column");
  if ((char)uVar2 == '\0') {
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->filename_column,(string *)local_70);
  }
  else {
    (*deserializer->_vptr_Deserializer[0x1a])(local_50,deserializer);
    ::std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->filename_column,(string *)local_50);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
  }
  (*deserializer->_vptr_Deserializer[5])(deserializer,(ulong)(uVar2 & 0xff));
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

MultiFileOptions MultiFileOptions::Deserialize(Deserializer &deserializer) {
	MultiFileOptions result;
	deserializer.ReadPropertyWithDefault<bool>(100, "filename", result.filename);
	deserializer.ReadPropertyWithDefault<bool>(101, "hive_partitioning", result.hive_partitioning);
	deserializer.ReadPropertyWithDefault<bool>(102, "auto_detect_hive_partitioning", result.auto_detect_hive_partitioning);
	deserializer.ReadPropertyWithDefault<bool>(103, "union_by_name", result.union_by_name);
	deserializer.ReadPropertyWithDefault<bool>(104, "hive_types_autocast", result.hive_types_autocast);
	deserializer.ReadPropertyWithDefault<case_insensitive_map_t<LogicalType>>(105, "hive_types_schema", result.hive_types_schema);
	deserializer.ReadPropertyWithExplicitDefault<string>(106, "filename_column", result.filename_column, MultiFileOptions::DEFAULT_FILENAME_COLUMN);
	return result;
}